

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O1

int HistoryItemInformationToken(pyhanabi_history_item_t *item)

{
  if (item == (pyhanabi_history_item_t *)0x0) {
    __assert_fail("item != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x102,"int HistoryItemInformationToken(pyhanabi_history_item_t *)");
  }
  if (item->item != (void *)0x0) {
    return (int)*(byte *)((long)item->item + 10);
  }
  __assert_fail("item->item != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x103,"int HistoryItemInformationToken(pyhanabi_history_item_t *)");
}

Assistant:

int HistoryItemInformationToken(pyhanabi_history_item_t* item) {
  REQUIRE(item != nullptr);
  REQUIRE(item->item != nullptr);
  return reinterpret_cast<const hanabi_learning_env::HanabiHistoryItem*>(
             item->item)
      ->information_token;
}